

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle_p_p.h
# Opt level: O0

QColor __thiscall QFusionStylePrivate::buttonColor(QFusionStylePrivate *this,QPalette *pal)

{
  undefined8 uVar1;
  QColor QVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QColor *pQVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  int val;
  QColor buttonColor;
  QRgb in_stack_ffffffffffffff94;
  undefined2 uStack_3a;
  undefined6 local_38;
  int local_30 [2];
  undefined6 uStack_28;
  undefined2 local_22;
  undefined6 uStack_20;
  undefined6 local_18;
  undefined2 uStack_12;
  undefined6 uStack_10;
  undefined2 uStack_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaa;
  uStack_12 = 0xaaaa;
  uStack_10 = 0xaaaaaaaaaaaa;
  uStack_a = 0xaaaa;
  QPalette::button((QPalette *)0x4f8606);
  pQVar6 = QBrush::color((QBrush *)0x4f860e);
  uVar1 = *(undefined8 *)((long)&pQVar6->ct + 4);
  local_18 = (undefined6)*(undefined8 *)pQVar6;
  uStack_12 = (undefined2)((ulong)*(undefined8 *)pQVar6 >> 0x30);
  uStack_10 = (undefined6)uVar1;
  uStack_a = (undefined2)((ulong)uVar1 >> 0x30);
  QColor::rgb();
  iVar3 = qGray(in_stack_ffffffffffffff94);
  local_30[1] = 1;
  local_30[0] = (0xb4 - iVar3) / 6;
  qMax<int>(local_30 + 1,local_30);
  auVar7 = QColor::lighter((int)&local_18);
  local_38 = auVar7._8_6_;
  uStack_3a = auVar7._6_2_;
  uStack_20 = local_38;
  uStack_28 = auVar7._0_6_;
  uStack_10 = local_38;
  local_22 = uStack_3a;
  local_18 = uStack_28;
  uStack_12 = uStack_3a;
  iVar3 = QColor::hue();
  iVar4 = QColor::saturation();
  iVar4 = (int)((double)iVar4 * 0.75);
  iVar5 = QColor::value();
  QColor::setHsv((int)&local_18,iVar3,iVar4,iVar5);
  QVar2.ct.argb.red = uStack_12;
  QVar2._0_6_ = local_18;
  QVar2._14_2_ = uStack_a;
  QVar2.ct._4_6_ = uStack_10;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QColor buttonColor(const QPalette &pal) const {
        QColor buttonColor = pal.button().color();
        int val = qGray(buttonColor.rgb());
        buttonColor = buttonColor.lighter(100 + qMax(1, (180 - val)/6));
        buttonColor.setHsv(buttonColor.hue(), buttonColor.saturation() * 0.75, buttonColor.value());
        return buttonColor;
    }